

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.h
# Opt level: O1

void __thiscall
std::_Optional_payload_base<dap::StoppedEvent>::_M_construct<dap::StoppedEvent>
          (_Optional_payload_base<dap::StoppedEvent> *this,StoppedEvent *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  (this->_M_payload)._M_value.allThreadsStopped.val.val = (__args->allThreadsStopped).val.val;
  (this->_M_payload)._M_value.allThreadsStopped.set = (__args->allThreadsStopped).set;
  paVar1 = &(this->_M_payload)._M_value.description.val.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&this->_M_payload + 8) = paVar1;
  pcVar2 = (__args->description).val._M_dataplus._M_p;
  paVar4 = &(__args->description).val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(__args->description).val.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_M_payload)._M_value.description.val.field_2 + 8) = uVar3;
  }
  else {
    (this->_M_payload)._M_value.description.val._M_dataplus._M_p = pcVar2;
    (this->_M_payload)._M_value.description.val.field_2._M_allocated_capacity =
         paVar4->_M_allocated_capacity;
  }
  (this->_M_payload)._M_value.description.val._M_string_length =
       (__args->description).val._M_string_length;
  (__args->description).val._M_dataplus._M_p = (pointer)paVar4;
  (__args->description).val._M_string_length = 0;
  (__args->description).val.field_2._M_local_buf[0] = '\0';
  *(bool *)((long)&this->_M_payload + 0x28) = (__args->description).set;
  (this->_M_payload)._M_value.hitBreakpointIds.val.
  super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.super__Vector_impl_data.
  _M_start = (__args->hitBreakpointIds).val.
             super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->_M_payload)._M_value.hitBreakpointIds.val.
  super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.super__Vector_impl_data.
  _M_finish = (__args->hitBreakpointIds).val.
              super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->_M_payload)._M_value.hitBreakpointIds.val.
  super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (__args->hitBreakpointIds).val.
       super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__args->hitBreakpointIds).val.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->hitBreakpointIds).val.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->hitBreakpointIds).val.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(bool *)((long)&this->_M_payload + 0x48) = (__args->hitBreakpointIds).set;
  (this->_M_payload)._M_value.preserveFocusHint.val.val = (__args->preserveFocusHint).val.val;
  (this->_M_payload)._M_value.preserveFocusHint.set = (__args->preserveFocusHint).set;
  paVar1 = &(this->_M_payload)._M_value.reason.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&this->_M_payload + 0x58) = paVar1;
  pcVar2 = (__args->reason)._M_dataplus._M_p;
  paVar4 = &(__args->reason).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(__args->reason).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_M_payload)._M_value.reason.field_2 + 8) = uVar3;
  }
  else {
    (this->_M_payload)._M_value.reason._M_dataplus._M_p = pcVar2;
    (this->_M_payload)._M_value.reason.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity
    ;
  }
  (this->_M_payload)._M_value.reason._M_string_length = (__args->reason)._M_string_length;
  (__args->reason)._M_dataplus._M_p = (pointer)paVar4;
  (__args->reason)._M_string_length = 0;
  (__args->reason).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->_M_payload)._M_value.text.val.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&this->_M_payload + 0x78) = paVar1;
  pcVar2 = (__args->text).val._M_dataplus._M_p;
  paVar4 = &(__args->text).val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(__args->text).val.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_M_payload)._M_value.text.val.field_2 + 8) = uVar3;
  }
  else {
    (this->_M_payload)._M_value.text.val._M_dataplus._M_p = pcVar2;
    (this->_M_payload)._M_value.text.val.field_2._M_allocated_capacity =
         paVar4->_M_allocated_capacity;
  }
  (this->_M_payload)._M_value.text.val._M_string_length = (__args->text).val._M_string_length;
  (__args->text).val._M_dataplus._M_p = (pointer)paVar4;
  (__args->text).val._M_string_length = 0;
  (__args->text).val.field_2._M_local_buf[0] = '\0';
  *(bool *)((long)&this->_M_payload + 0x98) = (__args->text).set;
  (this->_M_payload)._M_value.threadId.val.val = (__args->threadId).val.val;
  *(bool *)((long)&this->_M_payload + 0xa8) = (__args->threadId).set;
  this->_M_engaged = true;
  return;
}

Assistant:

optional<T>::optional(optional&& other)
    : val(std::move(other.val)), set(other.set) {}